

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

void pfd_open_confirmation(Channel *chan)

{
  long lVar1;
  
  if (chan->vt == &PortForwarding_channelvt) {
    *(undefined1 *)((long)&chan[-3].vt + 1) = 1;
    (**(code **)(**(long **)&chan[-4].initial_fixed_window_size + 0x28))
              (*(long **)&chan[-4].initial_fixed_window_size,0);
    (**(code **)(**(long **)&chan[-4].initial_fixed_window_size + 0x10))
              (*(long **)&chan[-4].initial_fixed_window_size,0,0);
    lVar1 = *(long *)&chan[-2].initial_fixed_window_size;
    if (lVar1 != 0) {
      (**(code **)**(undefined8 **)&chan[-5].initial_fixed_window_size)
                (*(undefined8 **)&chan[-5].initial_fixed_window_size,0,
                 (long)&(chan[-1].vt)->free + *(long *)(lVar1 + 8),
                 *(long *)(lVar1 + 0x10) - (long)chan[-1].vt);
      strbuf_free(*(strbuf **)&chan[-2].initial_fixed_window_size);
      *(undefined8 *)&chan[-2].initial_fixed_window_size = 0;
    }
    return;
  }
  __assert_fail("chan->vt == &PortForwarding_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c",
                0x29a,"void pfd_open_confirmation(Channel *)");
}

Assistant:

static void pfd_open_confirmation(Channel *chan)
{
    assert(chan->vt == &PortForwarding_channelvt);
    PortForwarding *pf = container_of(chan, PortForwarding, chan);

    pf->ready = true;
    sk_set_frozen(pf->s, false);
    sk_write(pf->s, NULL, 0);
    if (pf->socksbuf) {
        sshfwd_write(pf->c, pf->socksbuf->u + pf->socksbuf_consumed,
                     pf->socksbuf->len - pf->socksbuf_consumed);
        strbuf_free(pf->socksbuf);
        pf->socksbuf = NULL;
    }
}